

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

ScalarFunction * duckdb::StringSplitFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  FunctionNullHandling in_stack_ffffffffffffff38;
  allocator_type local_c1;
  code *bind_lambda;
  LogicalType local_a0 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  LogicalType varchar_list_type;
  LogicalType local_28;
  
  LogicalType::LogicalType(local_a0,VARCHAR);
  LogicalType::LIST(&varchar_list_type,local_a0);
  LogicalType::~LogicalType(local_a0);
  LogicalType::LogicalType(local_a0,VARCHAR);
  LogicalType::LogicalType(local_a0 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_a0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_58,__l,&local_c1);
  LogicalType::LogicalType(local_a0 + 2,&varchar_list_type);
  bind_lambda = StringSplitFunction;
  LogicalType::LogicalType(&local_28,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_28;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff24;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff2c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_58,local_a0 + 2,
             (scalar_function_t *)&stack0xffffffffffffff40,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff38,bind_lambda);
  LogicalType::~LogicalType(&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff40);
  LogicalType::~LogicalType(local_a0 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  LogicalType::~LogicalType(&varchar_list_type);
  return in_RDI;
}

Assistant:

ScalarFunction StringSplitFun::GetFunction() {
	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);

	ScalarFunction string_split({LogicalType::VARCHAR, LogicalType::VARCHAR}, varchar_list_type, StringSplitFunction);
	string_split.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return string_split;
}